

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusVtxbufFormat::emulate_mthd(MthdCelsiusVtxbufFormat *this)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  uint local_24;
  int local_20;
  int last;
  int i;
  int fmt;
  int comp;
  uint32_t err;
  MthdCelsiusVtxbufFormat *this_local;
  
  fmt = 0;
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3c);
  if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
    fmt = (int)(1 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x38);
    if (((uVar2 != 2) && (uVar2 != 3)) && (uVar2 != 4)) {
      fmt = 1;
    }
  }
  else if ((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 1) ||
          (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 2)) {
    if ((uVar2 != 0) && ((uVar2 != 3 && (uVar2 != 4)))) {
      fmt = 1;
    }
  }
  else if ((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 3) ||
          (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 4)) {
    fmt = (int)(4 < uVar2);
  }
  else if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 5) {
    if ((uVar2 != 0) && (uVar2 != 3)) {
      fmt = 1;
    }
  }
  else if ((((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 6) ||
            (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 7)) &&
           (uVar2 != 0)) && (uVar2 != 1)) {
    fmt = 1;
  }
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3c);
  if ((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 1) ||
     (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 2)) {
    if ((uVar2 != 0) && ((uVar2 != 2 && (uVar2 != 4)))) {
      fmt = 1;
    }
  }
  else if ((uVar2 != 1) && (uVar2 != 2)) {
    fmt = 1;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.val & 0xff000000) != 0) &&
     (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 != 0)) {
    fmt = fmt | 2;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.val & 0xff0300) != 0) {
    fmt = fmt | 2;
  }
  if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_config_c << 0x37) < 0) &&
     (((this->super_SingleMthdTest).super_MthdTest.cls == 0x56 ||
      ((this->super_SingleMthdTest).super_MthdTest.cls == 0x85)))) {
    fmt = fmt | 4;
  }
  if (fmt == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      uVar1 = pgraph_celsius_fixup_vtxbuf_format
                        (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                         *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914,
                         (this->super_SingleMthdTest).super_MthdTest.val);
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
      [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] = uVar1;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state &
           0xffffe0ff;
      for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
        [local_20] = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_pipe_vtxbuf_format[local_20] & 0xfeffffff |
                     (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp
                                     .celsius_pipe_vtxbuf_format[0] << 0x27) >> 0x3f) << 0x18);
      }
      if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset == 0x10) {
        if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
             celsius_pipe_vtxbuf_format[1] & 7) == 0) {
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
          [2] = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                celsius_pipe_vtxbuf_format[2] & 0xfffffffb;
        }
        else {
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
          [2] = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                celsius_pipe_vtxbuf_format[2] & 0xfffffffb | 4;
        }
      }
      local_24 = 7;
      while( true ) {
        bVar3 = false;
        if (0 < (int)local_24) {
          bVar3 = ((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          celsius_pipe_vtxbuf_format[(int)local_24] << 0x39) >> 0x3d == 0;
        }
        if (!bVar3) break;
        local_24 = local_24 - 1;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state &
           0xffffffe0 | local_24 & 0x1f;
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,fmt);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		int comp = extr(val, 4, 4);
		if (idx == 0) {
			if (extr(val, 24, 8) > 1)
				err |= 1;
			if (comp != 2 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 1 || idx == 2) {
			if (comp != 0 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 3 || idx == 4) {
			if (comp > 4)
				err |= 1;
		} else if (idx == 5) {
			if (comp != 0 && comp != 3)
				err |= 1;
		} else if (idx == 6 || idx == 7) {
			if (comp != 0 && comp != 1)
				err |= 1;
		}
		int fmt = extr(val, 0, 4);
		if (idx == 1 || idx == 2) {
			if (fmt != 0 && fmt != 2 && fmt != 4)
				err |= 1;
		} else {
			if (fmt != 1 && fmt != 2)
				err |= 1;
		}
		if (val & 0xff000000 && idx != 0)
			err |= 2;
		if (val & 0x00ff0300)
			err |= 2;
		if (extr(exp.celsius_config_c, 8, 1) && (cls == 0x56 || cls == 0x85))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_vtxbuf_format[idx] = pgraph_celsius_fixup_vtxbuf_format(&exp, idx, val);
				insrt(exp.celsius_pipe_vtx_state, 8, 5, 0);
				for (int i = 0; i < 8; i++) {
					insrt(exp.celsius_pipe_vtxbuf_format[i], 24, 1, extr(exp.celsius_pipe_vtxbuf_format[0], 24, 1));
				}
				if (chipset.chipset == 0x10) {
					if (extr(exp.celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 0);
					else
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 1);
				}
				int last = 7;
				while (last > 0 && extr(exp.celsius_pipe_vtxbuf_format[last], 4, 3) == 0)
					last--;
				insrt(exp.celsius_pipe_vtx_state, 0, 5, last);
			}
		}
	}